

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
** __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
::mutable_child(btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
                *this,size_type i)

{
  CopyConst<char,_ElementType<3UL>_> *ppbVar1;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (this[0xb] ==
      (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
       )0x0) {
    local_28 = 1;
    local_20 = 4;
    local_18 = 0xf;
    local_10 = 0x10;
    ppbVar1 = internal_layout::
              LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>*,unsigned_char,phmap::priv::map_slot_type<std::pair<int,int>,std::pair<int,int>>,phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
              ::Pointer<3ul,char>((LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>*,unsigned_char,phmap::priv::map_slot_type<std::pair<int,int>,std::pair<int,int>>,phmap::priv::btree_node<phmap::priv::map_params<std::pair<int,int>,std::pair<int,int>,phmap::Less<std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>const,std::pair<int,int>>>,256,true>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
                                   *)&local_28,(char *)this);
    return (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_true>_>
            **)(ppbVar1 + i);
  }
  __assert_fail("N < 3 || !leaf()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x47c,
                "typename layout_type::template ElementType<N> *phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>>::GetField() [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, true>, N = 3UL]"
               );
}

Assistant:

btree_node *&mutable_child(size_type i) { return GetField<3>()[i]; }